

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O1

FTexture * DDSTexture_TryCreate(FileReader *data,int lumpnum)

{
  int iVar1;
  undefined4 extraout_var;
  FDDSTexture *this;
  FileReader *lump;
  anon_union_124_2_f77b7ddb anon_var_0;
  DDSFileHeader Header;
  FileReader local_114;
  uint local_c8;
  int local_c4;
  int local_c0;
  int local_98;
  int local_94;
  uint local_90;
  int local_8c;
  int local_88;
  int local_4c;
  
  (*(data->super_FileReaderBase)._vptr_FileReaderBase[4])(data,0,0);
  iVar1 = (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,&local_98,0x80);
  if (((((CONCAT44(extraout_var,iVar1) == 0x80) && (local_98 == 0x20534444)) &&
       (local_94 == 0x7c || local_94 == 0x20534444)) &&
      ((local_4c == 0x20 && ((~local_90 & 0x1007) == 0)))) && ((local_88 != 0 && (local_8c != 0))))
  {
    (*(data->super_FileReaderBase)._vptr_FileReaderBase[4])(data,4,0);
    lump = &local_114;
    (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,lump,0x7c);
    if ((local_c8 & 4) == 0) {
      if ((((local_c8 & 0x40) != 0) && (0xffffffdf < local_c0 - 0x28U)) &&
         (((local_114.super_FileReaderBase._vptr_FileReaderBase._4_1_ & 8) == 0 ||
          (0 < (int)local_114.Length)))) {
LAB_004fa95e:
        this = (FDDSTexture *)operator_new(0x90);
        FDDSTexture::FDDSTexture(this,lump,lumpnum,&local_114);
        return &this->super_FTexture;
      }
    }
    else if ((((local_c4 + 0xceaba7bcU) * 0x100 | local_c4 + 0xceaba7bcU >> 0x18) < 5) &&
            ((local_114.super_FileReaderBase._vptr_FileReaderBase._6_1_ & 8) != 0))
    goto LAB_004fa95e;
  }
  return (FTexture *)0x0;
}

Assistant:

FTexture *DDSTexture_TryCreate (FileReader &data, int lumpnum)
{
	union
	{
		DDSURFACEDESC2	surfdesc;
		DWORD			byteswapping[sizeof(DDSURFACEDESC2) / 4];
	};

	if (!CheckDDS(data)) return NULL;

	data.Seek (4, SEEK_SET);
	data.Read (&surfdesc, sizeof(surfdesc));

#ifdef __BIG_ENDIAN__
	// Every single element of the header is a DWORD
	for (unsigned int i = 0; i < sizeof(DDSURFACEDESC2) / 4; ++i)
	{
		byteswapping[i] = LittleLong(byteswapping[i]);
	}
	// Undo the byte swap for the pixel format
	surfdesc.PixelFormat.FourCC = LittleLong(surfdesc.PixelFormat.FourCC);
#endif

	if (surfdesc.PixelFormat.Flags & DDPF_FOURCC)
	{
		// Check for supported FourCC
		if (surfdesc.PixelFormat.FourCC != ID_DXT1 &&
			surfdesc.PixelFormat.FourCC != ID_DXT2 &&
			surfdesc.PixelFormat.FourCC != ID_DXT3 &&
			surfdesc.PixelFormat.FourCC != ID_DXT4 &&
			surfdesc.PixelFormat.FourCC != ID_DXT5)
		{
			return NULL;
		}
		if (!(surfdesc.Flags & DDSD_LINEARSIZE))
		{
			return NULL;
		}
	}
	else if (surfdesc.PixelFormat.Flags & DDPF_RGB)
	{
		if ((surfdesc.PixelFormat.RGBBitCount >> 3) < 1 ||
			(surfdesc.PixelFormat.RGBBitCount >> 3) > 4)
		{
			return NULL;
		}
		if ((surfdesc.Flags & DDSD_PITCH) && (surfdesc.Pitch <= 0))
		{
			return NULL;
		}
	}
	else
	{
		return NULL;
	}
	return new FDDSTexture (data, lumpnum, &surfdesc);
}